

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_3)

{
  string *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_e8 [16];
  long *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  UnitTest::Passed((UnitTest *)0x2357a8);
  __lhs = &local_b8;
  FormatBool_abi_cxx11_
            ((StreamingListener *)in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  message = (string *)UnitTest::elapsed_time((UnitTest *)0x2357ff);
  StreamableToString<long>(in_stack_ffffffffffffff28);
  std::operator+(in_stack_ffffffffffffff38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::operator+(__lhs,(char *)in_RDI);
  SendLn((StreamingListener *)in_RDI,message);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test,
                          int /* iteration */) override {
    SendLn("event=TestIterationEnd&passed=" + FormatBool(unit_test.Passed()) +
           "&elapsed_time=" + StreamableToString(unit_test.elapsed_time()) +
           "ms");
  }